

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPrimitiveCoverage.cpp
# Opt level: O2

bool __thiscall
glcts::TessellationShaderPrimitiveCoverage::verifyDrawBufferContents
          (TessellationShaderPrimitiveCoverage *this)

{
  ostringstream *this_00;
  GLubyte *pGVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  ulong uVar5;
  GLubyte rendered_result_ubyte [4];
  GLubyte expected_result_ubyte [4];
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x1218))(0x8ce0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glReadBuffer() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x2a9);
  uVar5 = 0;
  (**(code **)(lVar4 + 0x1220))(0,0,0x800,0x800,0x1908,0x1401,this->m_rendered_data_buffer);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glReadPixels() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                  ,0x2b0);
  pGVar1 = this->m_rendered_data_buffer;
  do {
    if (0x3fffff < uVar5) {
LAB_00d130da:
      return 0x3fffff < uVar5;
    }
    rendered_result_ubyte[0] = pGVar1[uVar5];
    rendered_result_ubyte[1] = pGVar1[uVar5 + 1];
    rendered_result_ubyte[2] = pGVar1[uVar5 + 2];
    rendered_result_ubyte[3] = pGVar1[uVar5 + 3];
    if (rendered_result_ubyte != (GLubyte  [4])0x204080ff) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Rendered pixel at index (");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,") of value (");
      std::operator<<((ostream *)this_00,rendered_result_ubyte[0]);
      std::operator<<((ostream *)this_00,", ");
      std::operator<<((ostream *)this_00,rendered_result_ubyte[1]);
      std::operator<<((ostream *)this_00,", ");
      std::operator<<((ostream *)this_00,rendered_result_ubyte[2]);
      std::operator<<((ostream *)this_00,", ");
      std::operator<<((ostream *)this_00,rendered_result_ubyte[3]);
      std::operator<<((ostream *)this_00,") does not match expected pixel (");
      std::operator<<((ostream *)this_00,-1);
      std::operator<<((ostream *)this_00,", ");
      std::operator<<((ostream *)this_00,-0x80);
      std::operator<<((ostream *)this_00,", ");
      std::operator<<((ostream *)this_00,'@');
      std::operator<<((ostream *)this_00,", ");
      std::operator<<((ostream *)this_00,' ');
      std::operator<<((ostream *)this_00,")");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      goto LAB_00d130da;
    }
    uVar5 = uVar5 + 4;
  } while( true );
}

Assistant:

bool TessellationShaderPrimitiveCoverage::verifyDrawBufferContents(void)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch the data */
	gl.readBuffer(GL_COLOR_ATTACHMENT0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer() failed");

	gl.readPixels(0,						  /* x */
				  0,						  /* y */
				  m_height, m_width, GL_RGBA, /* format */
				  GL_UNSIGNED_BYTE,			  /* type */
				  m_rendered_data_buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() failed");

	/* Verify result data */
	bool result = true;

	for (glw::GLuint n_pixel = 0; n_pixel < (m_rendered_data_buffer_size >> 2); n_pixel += m_n_components)
	{
		glw::GLubyte expected_result_ubyte[] = { (glw::GLubyte)(m_clear_color[0] * 255.0f),
												 (glw::GLubyte)(m_clear_color[1] * 255.0f),
												 (glw::GLubyte)(m_clear_color[2] * 255.0f),
												 (glw::GLubyte)(m_clear_color[3] * 255.0f) };
		glw::GLubyte rendered_result_ubyte[] = { m_rendered_data_buffer[n_pixel + 0],
												 m_rendered_data_buffer[n_pixel + 1],
												 m_rendered_data_buffer[n_pixel + 2],
												 m_rendered_data_buffer[n_pixel + 3] };

		if (memcmp(expected_result_ubyte, rendered_result_ubyte, sizeof(rendered_result_ubyte)) != 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Rendered pixel at index (" << n_pixel << ") of value"
																									 " ("
							   << rendered_result_ubyte[0] << ", " << rendered_result_ubyte[1] << ", "
							   << rendered_result_ubyte[2] << ", " << rendered_result_ubyte[3]
							   << ") does not match expected pixel"
								  " ("
							   << expected_result_ubyte[0] << ", " << expected_result_ubyte[1] << ", "
							   << expected_result_ubyte[2] << ", " << expected_result_ubyte[3] << ")"
							   << tcu::TestLog::EndMessage;

			result = false;

			break;
		} /* if (rendered pixel is invalid) */
	}	 /* for (all pixels) */

	return result;
}